

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O1

int lws_role_call_alpn_negotiated(lws *wsi,char *alpn)

{
  lws_role_ops *plVar1;
  bool bVar2;
  int iVar3;
  lws_log_cx *cx;
  int unaff_EBP;
  lws_role_ops *ar;
  lws_role_ops **pplVar4;
  
  if (alpn == (char *)0x0) {
LAB_00111fd1:
    unaff_EBP = 0;
  }
  else {
    cx = lwsl_wsi_get_cx(wsi);
    _lws_log_cx(cx,lws_log_prepend_wsi,wsi,8,"lws_role_call_alpn_negotiated","\'%s\'",alpn);
    pplVar4 = available_roles;
    do {
      plVar1 = *pplVar4;
      if (plVar1 == (lws_role_ops *)0x0) goto LAB_00111fd1;
      bVar2 = true;
      if (((plVar1->alpn != (char *)0x0) && (iVar3 = strcmp(plVar1->alpn,alpn), iVar3 == 0)) &&
         (0xf < plVar1->rops_idx[6])) {
        unaff_EBP = (*plVar1->rops_table[(plVar1->rops_idx[6] >> 4) - 1].check_upgrades)(wsi);
        bVar2 = false;
      }
      pplVar4 = pplVar4 + 1;
    } while (bVar2);
  }
  return unaff_EBP;
}

Assistant:

int
lws_role_call_alpn_negotiated(struct lws *wsi, const char *alpn)
{
#if defined(LWS_WITH_TLS)
	if (!alpn)
		return 0;

#if !defined(LWS_ESP_PLATFORM)
	lwsl_wsi_info(wsi, "'%s'", alpn);
#endif

	LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar)
		if (ar->alpn && !strcmp(ar->alpn, alpn) &&
		    lws_rops_fidx(ar, LWS_ROPS_alpn_negotiated)) {
#if defined(LWS_WITH_SERVER)
			lws_metrics_tag_wsi_add(wsi, "upg", ar->name);
#endif
			return (lws_rops_func_fidx(ar, LWS_ROPS_alpn_negotiated)).
						   alpn_negotiated(wsi, alpn);
		}
	LWS_FOR_EVERY_AVAILABLE_ROLE_END;
#endif
	return 0;
}